

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<unsigned_long> * __thiscall
kj::ArrayBuilder<unsigned_long>::operator=
          (ArrayBuilder<unsigned_long> *this,ArrayBuilder<unsigned_long> *other)

{
  unsigned_long *puVar1;
  RemoveConst<unsigned_long> *pRVar2;
  unsigned_long *puVar3;
  ArrayDisposer *pAVar4;
  
  puVar1 = this->ptr;
  if (puVar1 != (unsigned_long *)0x0) {
    pRVar2 = this->pos;
    puVar3 = this->endPtr;
    this->ptr = (unsigned_long *)0x0;
    this->pos = (RemoveConst<unsigned_long> *)0x0;
    this->endPtr = (unsigned_long *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,puVar1,8,(long)pRVar2 - (long)puVar1 >> 3,
               (long)puVar3 - (long)puVar1 >> 3,0);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (unsigned_long *)0x0;
  other->pos = (RemoveConst<unsigned_long> *)0x0;
  other->endPtr = (unsigned_long *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }